

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

double duckdb::SqrtOperator::Operation<double,double>(double input)

{
  OutOfRangeException *this;
  double dVar1;
  allocator local_39;
  string local_38;
  
  if (input < 0.0) {
    this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"cannot take square root of a negative number",&local_39);
    OutOfRangeException::OutOfRangeException(this,&local_38);
    __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (0.0 <= input) {
    return SQRT(input);
  }
  dVar1 = sqrt(input);
  return dVar1;
}

Assistant:

static inline TR Operation(TA input) {
		if (input < 0) {
			throw OutOfRangeException("cannot take square root of a negative number");
		}
		return std::sqrt(input);
	}